

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

void __thiscall CoreML::Model::Model(Model *this,string *description)

{
  element_type *peVar1;
  string *psVar2;
  ModelDescription *pMVar3;
  Metadata *this_00;
  
  Model(this);
  peVar1 = (this->m_spec).
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(pMVar3);
    peVar1->description_ = pMVar3;
  }
  pMVar3 = peVar1->description_;
  if (pMVar3->metadata_ == (Metadata *)0x0) {
    this_00 = (Metadata *)operator_new(0x58);
    Specification::Metadata::Metadata(this_00);
    pMVar3->metadata_ = this_00;
  }
  psVar2 = (pMVar3->metadata_->shortdescription_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pMVar3->metadata_->shortdescription_,description);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  return;
}

Assistant:

Model::Model(const std::string& description)
    : Model::Model() {
        Specification::Metadata* metadata = m_spec->mutable_description()->mutable_metadata();
        metadata->set_shortdescription(description);
    }